

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> * __thiscall
kj::ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::operator=
          (ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *this,
          ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> *other)

{
  Dependency *pDVar1;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar2;
  Dependency *pDVar3;
  ArrayDisposer *pAVar4;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (Dependency *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->ptr = (Dependency *)0x0;
    this->pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
    this->endPtr = (Dependency *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pDVar1,0x10,(long)pRVar2 - (long)pDVar1 >> 4,
               (long)pDVar3 - (long)pDVar1 >> 4,0);
  }
  pRVar2 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar2;
  pAVar4 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar4;
  other->ptr = (Dependency *)0x0;
  other->pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
  other->endPtr = (Dependency *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }